

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmInstruction *inst)

{
  VmInstructionType VVar1;
  uint uVar2;
  VmValue **ppVVar3;
  VmValue *pVVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  if ((((inst->super_VmValue).users.count == 0) && ((inst->super_VmValue).hasSideEffects == false))
     && ((inst->super_VmValue).canBeRemoved == true)) {
    module->deadCodeEliminations = module->deadCodeEliminations + 1;
    if (inst->parent == (VmBlock *)0x0) {
      return;
    }
    VmBlock::RemoveInstruction(inst->parent,inst);
    return;
  }
  VVar1 = inst->cmd;
  if (1 < VVar1 - VM_INST_JUMP_Z) {
    if (VVar1 != VM_INST_PHI) {
      return;
    }
    uVar8 = (inst->arguments).count;
    uVar5 = (ulong)uVar8;
    if (uVar8 == 0) {
      return;
    }
    uVar8 = 0;
    while (uVar7 = uVar8 + 1, uVar7 < (uint)uVar5) {
      ppVVar3 = (inst->arguments).data;
      pVVar4 = ppVVar3[uVar7];
      if (((pVVar4->users).count == 1) && ((VmInstruction *)*(pVVar4->users).data == inst)) {
        VmValue::RemoveUse(ppVVar3[uVar8],&inst->super_VmValue);
        VmValue::RemoveUse(pVVar4,&inst->super_VmValue);
        uVar2 = (inst->arguments).count;
        if ((uVar2 < 2) || (uVar2 <= uVar8)) break;
        ppVVar3 = (inst->arguments).data;
        uVar5 = (ulong)(uVar2 - 2);
        ppVVar3[uVar8] = ppVVar3[uVar5];
        if (uVar2 <= uVar7) break;
        ppVVar3 = (inst->arguments).data;
        ppVVar3[uVar7] = ppVVar3[uVar2 - 1];
        (inst->arguments).count = uVar2 - 2;
      }
      else {
        uVar8 = uVar8 + 2;
      }
      if ((uint)uVar5 <= uVar8) {
        return;
      }
    }
    goto LAB_001b03a5;
  }
  uVar8 = (inst->arguments).count;
  if (uVar8 == 0) goto LAB_001b03a5;
  ppVVar3 = (inst->arguments).data;
  pVVar4 = *ppVVar3;
  if (pVVar4 == (VmValue *)0x0) {
    return;
  }
  if (pVVar4->typeID != 1) {
    return;
  }
  if (VVar1 == VM_INST_JUMP_Z) {
    if (*(int *)&pVVar4[1]._vptr_VmValue == 0) {
LAB_001b035b:
      lVar6 = 8;
      if (uVar8 == 1) goto LAB_001b03a5;
      goto LAB_001b0365;
    }
  }
  else if (*(int *)&pVVar4[1]._vptr_VmValue != 0) goto LAB_001b035b;
  lVar6 = 0x10;
  if (uVar8 < 3) {
LAB_001b03a5:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
LAB_001b0365:
  anon_unknown.dwarf_12e14a::ChangeInstructionTo
            ((VmModule *)module->allocator,inst,VM_INST_JUMP,*(VmValue **)((long)ppVVar3 + lVar6),
             (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
             &module->deadCodeEliminations);
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmInstruction *inst)
{
	(void)ctx;

	if(inst->users.empty() && !inst->hasSideEffects && inst->canBeRemoved)
	{
		module->deadCodeEliminations++;

		if(inst->parent)
			inst->parent->RemoveInstruction(inst);
	}
	else if(inst->cmd == VM_INST_JUMP_Z || inst->cmd == VM_INST_JUMP_NZ)
	{
		// Remove conditional branches with constant condition
		if(VmConstant *condition = getType<VmConstant>(inst->arguments[0]))
		{
			if(inst->cmd == VM_INST_JUMP_Z)
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[1] : inst->arguments[2], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
			else
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[2] : inst->arguments[1], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
		}
	}
	else if(inst->cmd == VM_INST_PHI)
	{
		// Remove incoming branches that are never executed (phi instruction is the only user)
		for(unsigned i = 0; i < inst->arguments.size();)
		{
			VmValue *option = inst->arguments[i];
			VmValue *edge = inst->arguments[i + 1];

			if(edge->users.size() == 1 && edge->users[0] == inst)
			{
				option->RemoveUse(inst);
				edge->RemoveUse(inst);

				inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
				inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

				inst->arguments.pop_back();
				inst->arguments.pop_back();
			}
			else
			{
				i += 2;
			}
		}
	}
}